

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

dxil_spv_result dxil_spv_parse_dxil_blob(void *data,size_t size,dxil_spv_parsed_blob *blob)

{
  pointer pRVar1;
  pointer pRVar2;
  bool bVar3;
  dxil_spv_parsed_blob_s *this;
  Vector<uint8_t> *__x;
  Vector<RDATSubobject> *__x_00;
  uchar *data_00;
  size_type size_00;
  char *pcVar4;
  LLVMBCParser *parser_00;
  dxil_spv_parsed_blob_s *local_1d8;
  value_type local_1d0;
  String *local_d0;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *name;
  iterator __end1;
  iterator __begin1;
  Vector<String> *__range1;
  Vector<String> names;
  undefined1 local_90 [8];
  DXILContainerParser parser;
  dxil_spv_parsed_blob_s *parsed;
  dxil_spv_parsed_blob *blob_local;
  size_t size_local;
  void *data_local;
  
  this = (dxil_spv_parsed_blob_s *)operator_new(0x70,(nothrow_t *)&std::nothrow);
  local_1d8 = (dxil_spv_parsed_blob_s *)0x0;
  if (this != (dxil_spv_parsed_blob_s *)0x0) {
    dxil_spv_parsed_blob_s::dxil_spv_parsed_blob_s(this);
    local_1d8 = this;
  }
  parser.rdat_subobjects.
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1d8;
  if (local_1d8 == (dxil_spv_parsed_blob_s *)0x0) {
    data_local._4_4_ = DXIL_SPV_ERROR_OUT_OF_MEMORY;
  }
  else {
    dxil_spv::DXILContainerParser::DXILContainerParser((DXILContainerParser *)local_90);
    bVar3 = dxil_spv::DXILContainerParser::parse_container
                      ((DXILContainerParser *)local_90,data,size,false);
    pRVar1 = parser.rdat_subobjects.
             super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (bVar3) {
      __x = dxil_spv::DXILContainerParser::get_blob((DXILContainerParser *)local_90);
      std::vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_> *)
                 &((parser.rdat_subobjects.
                    super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->exports).
                  super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,__x);
      __x_00 = dxil_spv::DXILContainerParser::get_rdat_subobjects((DXILContainerParser *)local_90);
      std::vector<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
      ::operator=((vector<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                   *)&(parser.rdat_subobjects.
                       super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->payload_size,__x_00);
      pRVar1 = parser.rdat_subobjects.
               super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      data_00 = std::vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_> *)
                           &((parser.rdat_subobjects.
                              super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->exports).
                            super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      size_00 = std::vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_> *)
                           &((parser.rdat_subobjects.
                              super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->exports).
                            super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = dxil_spv::LLVMBCParser::parse((LLVMBCParser *)pRVar1,data_00,size_00);
      pRVar1 = parser.rdat_subobjects.
               super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar3) {
        dxil_spv::Converter::get_entry_points_abi_cxx11_
                  ((Vector<String> *)&__range1,
                   (Converter *)
                   parser.rdat_subobjects.
                   super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,parser_00);
        __end1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                          *)&__range1);
        name = (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                      *)&__range1);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
                                      *)&name);
          if (!bVar3) break;
          local_d0 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
                     ::operator*(&__end1);
          pRVar1 = parser.rdat_subobjects.
                   super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          basic_string(&local_1d0.mangled,local_d0);
          dxil_spv::demangle_entry_point(&local_1d0.demangled,local_d0);
          pRVar2 = parser.rdat_subobjects.
                   super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pcVar4 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                   ::c_str(local_d0);
          dxil_spv::Converter::get_node_input(&local_1d0.node_input,(LLVMBCParser *)pRVar2,pcVar4);
          pRVar2 = parser.rdat_subobjects.
                   super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pcVar4 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                   ::c_str(local_d0);
          dxil_spv::Converter::get_node_outputs
                    (&local_1d0.node_outputs,(LLVMBCParser *)pRVar2,pcVar4);
          std::
          vector<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
          ::push_back((vector<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
                       *)&pRVar1->hit_group_type,&local_1d0);
          dxil_spv_parsed_blob_s::EntryPoint::~EntryPoint(&local_1d0);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
          ::operator++(&__end1);
        }
        *blob = (dxil_spv_parsed_blob)
                parser.rdat_subobjects.
                super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        data_local._4_4_ = DXIL_SPV_SUCCESS;
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                   *)&__range1);
      }
      else {
        if (parser.rdat_subobjects.
            super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          dxil_spv_parsed_blob_s::~dxil_spv_parsed_blob_s
                    ((dxil_spv_parsed_blob_s *)
                     parser.rdat_subobjects.
                     super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          operator_delete(pRVar1,0x70);
        }
        data_local._4_4_ = DXIL_SPV_ERROR_PARSER;
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
    }
    else {
      if (parser.rdat_subobjects.
          super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        dxil_spv_parsed_blob_s::~dxil_spv_parsed_blob_s
                  ((dxil_spv_parsed_blob_s *)
                   parser.rdat_subobjects.
                   super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        operator_delete(pRVar1,0x70);
      }
      data_local._4_4_ = DXIL_SPV_ERROR_PARSER;
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    dxil_spv::DXILContainerParser::~DXILContainerParser((DXILContainerParser *)local_90);
  }
  return data_local._4_4_;
}

Assistant:

dxil_spv_result dxil_spv_parse_dxil_blob(const void *data, size_t size, dxil_spv_parsed_blob *blob)
{
	auto *parsed = new (std::nothrow) dxil_spv_parsed_blob_s;
	if (!parsed)
		return DXIL_SPV_ERROR_OUT_OF_MEMORY;

	DXILContainerParser parser;
	if (!parser.parse_container(data, size, false))
	{
		delete parsed;
		return DXIL_SPV_ERROR_PARSER;
	}

	parsed->dxil_blob = std::move(parser.get_blob());
	parsed->rdat_subobjects = std::move(parser.get_rdat_subobjects());

	if (!parsed->bc.parse(parsed->dxil_blob.data(), parsed->dxil_blob.size()))
	{
		delete parsed;
		return DXIL_SPV_ERROR_PARSER;
	}

	auto names = Converter::get_entry_points(parsed->bc);
	for (auto &name : names)
	{
		parsed->entry_points.push_back({
			name, demangle_entry_point(name),
			Converter::get_node_input(parsed->bc, name.c_str()),
			Converter::get_node_outputs(parsed->bc, name.c_str())
		});
	}

	*blob = parsed;
	return DXIL_SPV_SUCCESS;
}